

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.h
# Opt level: O2

void __thiscall trieste::logging::Log::end(Log *this)

{
  if (this->print == Active) {
    std::endl<char,std::char_traits<char>>((ostream *)((this->strstream).data + 0x10));
    CLI::std::
    function<void_(std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::operator()((function<void_(std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                  *)&dump_callback_abi_cxx11_,
                 (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &this->strstream);
  }
  (*(code *)**(undefined8 **)(this->strstream).data)(&this->strstream);
  return;
}

Assistant:

SNMALLOC_SLOW_PATH void end()
    {
      if (print == Status::Active)
      {
        strstream.get() << std::endl;
        dump_callback(strstream.get());
      }
      strstream.destruct();
    }